

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O0

void logevent_internal(LogContext *ctx,char *event)

{
  char *event_local;
  LogContext *ctx_local;
  
  if ((ctx->logtype == 3) || (ctx->logtype == 4)) {
    logprintf(ctx,"Event Log: %s\r\n",event);
    logflush(ctx);
  }
  lp_eventlog(ctx->lp,event);
  return;
}

Assistant:

static void logevent_internal(LogContext *ctx, const char *event)
{
    if (ctx->logtype == LGTYP_PACKETS || ctx->logtype == LGTYP_SSHRAW) {
        logprintf(ctx, "Event Log: %s\r\n", event);
        logflush(ctx);
    }
    lp_eventlog(ctx->lp, event);
}